

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O2

void __thiscall
Js::StackScriptFunction::BoxState::BoxState
          (BoxState *this,ArenaAllocator *alloc,FunctionBody *functionBody,
          ScriptContext *scriptContext,void *returnAddress)

{
  NestedArray *pNVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  FunctionBody *this_00;
  FunctionInfo *this_01;
  uint i;
  uint index;
  FunctionBody *local_40;
  FunctionBody *current;
  FunctionProxy *nested;
  
  JsUtil::
  BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    *)this,alloc,0);
  JsUtil::
  BaseDictionary<Js::FunctionProxy_*,_Js::FunctionProxy_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&(this->functionObjectToBox).
                    super_BaseDictionary<Js::FunctionProxy_*,_Js::FunctionProxy_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ,alloc,0);
  JsUtil::
  BaseDictionary<void_*,_void_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->boxedValues,alloc,0);
  this->scriptContext = scriptContext;
  this->returnAddress = returnAddress;
  if (((((functionBody->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) == Flags_None)
      || (pNVar1 = (functionBody->super_ParseableFunctionInfo).nestedArray.ptr,
         pNVar1 == (NestedArray *)0x0)) || (pNVar1->nestedCount == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                ,0x70,
                                "(functionBody->DoStackNestedFunc() && functionBody->GetNestedCount() != 0)"
                                ,
                                "functionBody->DoStackNestedFunc() && functionBody->GetNestedCount() != 0"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  local_40 = functionBody;
  do {
    JsUtil::
    BaseHashSet<Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Add(&this->frameToBox,&local_40);
    index = 0;
    while( true ) {
      pNVar1 = (local_40->super_ParseableFunctionInfo).nestedArray.ptr;
      uVar4 = 0;
      if (pNVar1 != (NestedArray *)0x0) {
        uVar4 = pNVar1->nestedCount;
      }
      if (uVar4 <= index) break;
      current = (FunctionBody *)
                ParseableFunctionInfo::GetNestedFunctionProxy
                          (&local_40->super_ParseableFunctionInfo,index);
      JsUtil::
      BaseHashSet<Js::FunctionProxy_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionProxy_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Add(&this->functionObjectToBox,(FunctionProxy **)&current);
      bVar3 = FunctionProxy::IsFunctionBody((FunctionProxy *)current);
      if (bVar3) {
        this_00 = FunctionProxy::GetFunctionBody((FunctionProxy *)current);
        FunctionBody::ClearStackNestedFuncParent(this_00);
      }
      index = index + 1;
    }
    this_01 = FunctionBody::GetAndClearStackNestedFuncParent(local_40);
    if (this_01 == (FunctionInfo *)0x0) {
      return;
    }
    local_40 = FunctionInfo::GetFunctionBody(this_01);
    if (local_40 == (FunctionBody *)0x0) {
      return;
    }
  } while (((local_40->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) != Flags_None);
  return;
}

Assistant:

StackScriptFunction::BoxState::BoxState(ArenaAllocator * alloc, FunctionBody * functionBody, ScriptContext * scriptContext, void * returnAddress) :
        frameToBox(alloc), functionObjectToBox(alloc), boxedValues(alloc), scriptContext(scriptContext), returnAddress(returnAddress)
    {
        Assert(functionBody->DoStackNestedFunc() && functionBody->GetNestedCount() != 0);
        FunctionBody * current = functionBody;
        do
        {
            frameToBox.Add(current);

            for (uint i = 0; i < current->GetNestedCount(); i++)
            {
                FunctionProxy * nested = current->GetNestedFunctionProxy(i);
                functionObjectToBox.Add(nested);
                if (nested->IsFunctionBody())
                {
                    nested->GetFunctionBody()->ClearStackNestedFuncParent();
                }
            }
            FunctionInfo * functionInfo = current->GetAndClearStackNestedFuncParent();
            current = functionInfo ? functionInfo->GetFunctionBody() : nullptr;
        }
        while (current && current->DoStackNestedFunc());
    }